

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upsync_module.c
# Opt level: O3

char * ngx_http_upsync_set_lb(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  long lVar2;
  long *plVar3;
  undefined8 uVar4;
  
  pvVar1 = cf->args->elts;
  lVar2 = *(long *)((long)pvVar1 + 0x10);
  if (lVar2 < 10) {
    if (lVar2 == -1) {
      uVar4 = 0;
    }
    else {
      if (lVar2 != 7) {
        return (char *)0x0;
      }
      if (*(int *)((long)*(int **)((long)pvVar1 + 0x18) + 3) != 0x68736168 ||
          **(int **)((long)pvVar1 + 0x18) != 0x685f7069) {
        return (char *)0x0;
      }
      uVar4 = 2;
    }
  }
  else if (lVar2 == 10) {
    plVar3 = *(long **)((long)pvVar1 + 0x18);
    if ((short)plVar3[1] == 0x6e69 && *plVar3 == 0x626f72646e756f72) {
      uVar4 = 1;
    }
    else {
      if ((short)plVar3[1] != 0x6e6e || *plVar3 != 0x6f635f747361656c) {
        return (char *)0x0;
      }
      uVar4 = 4;
    }
  }
  else {
    if (lVar2 != 0xb) {
      return (char *)0x0;
    }
    plVar3 = *(long **)((long)pvVar1 + 0x18);
    if (*(long *)((long)plVar3 + 3) == 0x616c75646f6d5f68 && *plVar3 == 0x646f6d5f68736168) {
      uVar4 = 8;
    }
    else {
      if (*(long *)((long)plVar3 + 3) != 0x616d6174656b5f68 || *plVar3 != 0x74656b5f68736168) {
        return (char *)0x0;
      }
      uVar4 = 0x10;
    }
  }
  *(undefined8 *)
   (*(long *)(*(long *)((long)cf->ctx + 8) + ngx_http_upsync_module.ctx_index * 8) + 0x28) = uVar4;
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_upsync_set_lb(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_str_t                         *value, *str;
    ngx_http_upsync_srv_conf_t        *upscf;

    upscf = ngx_http_conf_get_module_srv_conf(cf,
                                              ngx_http_upsync_module);
    value = cf->args->elts;

    str = &value[1];
    if (str->len == NGX_CONF_UNSET_SIZE) {
        upscf->upsync_lb = NGX_HTTP_LB_DEFAULT;

        return NGX_CONF_OK; 
    }

    switch(str->len) {
        case 7:
            if (ngx_memcmp((char *)str->data, "ip_hash", 7) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_IP_HASH;

                return NGX_CONF_OK;
            }

            break;

        case 10:
            if (ngx_memcmp((char *)str->data, "roundrobin", 10) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_ROUNDROBIN;

                return NGX_CONF_OK;
            }

            if (ngx_memcmp((char *)str->data, "least_conn", 10) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_LEAST_CONN;

                return NGX_CONF_OK;
            }

            break;

        case 11:
            if (ngx_memcmp((char *)str->data, "hash_modula", 11) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_HASH_MODULA;

                return NGX_CONF_OK;
            }

            if (ngx_memcmp((char *)str->data, "hash_ketama", 11) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_HASH_KETAMA;

                return NGX_CONF_OK;
            }

            break;
    }

    return NGX_CONF_OK;
}